

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool parse_attributes(char **begin,char *end,element_t *element,plutosvg_document_t *document)

{
  char cVar1;
  char *pcVar2;
  int id_00;
  int length_00;
  char *pcVar3;
  hashmap_t *phVar4;
  bool bVar5;
  int length;
  char quote;
  int id;
  char *data;
  char *it;
  plutosvg_document_t *document_local;
  element_t *element_local;
  char *end_local;
  char **begin_local;
  
  data = *begin;
  it = (char *)document;
  document_local = (plutosvg_document_t *)element;
  element_local = (element_t *)end;
  end_local = (char *)begin;
  while( true ) {
    pcVar2 = data;
    bVar5 = false;
    if ((((data < element_local) && ((*data < 'a' || (bVar5 = true, 'z' < *data)))) &&
        ((*data < 'A' || (bVar5 = true, 'Z' < *data)))) && (bVar5 = true, *data != '_')) {
      bVar5 = *data == ':';
    }
    if (!bVar5) {
      *(char **)end_local = data;
      return true;
    }
    do {
      data = data + 1;
      bVar5 = false;
      if (((data < element_local) && ((*data < 'a' || (bVar5 = true, 'z' < *data)))) &&
         (((*data < 'A' || (bVar5 = true, 'Z' < *data)) &&
          ((((bVar5 = true, *data != '_' && (bVar5 = true, *data != ':')) &&
            ((*data < '0' || (bVar5 = true, '9' < *data)))) && (bVar5 = true, *data != '-')))))) {
        bVar5 = *data == '.';
      }
    } while (bVar5);
    id_00 = attributeid(pcVar2,(long)data - (long)pcVar2);
    skip_ws(&data,(char *)element_local);
    if ((element_local <= data) || (*data != '=')) break;
    data = data + 1;
    skip_ws(&data,(char *)element_local);
    if ((element_local <= data) || ((*data != '\"' && (*data != '\'')))) {
      return false;
    }
    cVar1 = *data;
    data = data + 1;
    skip_ws(&data,(char *)element_local);
    pcVar2 = data;
    while( true ) {
      bVar5 = false;
      if (data < element_local) {
        bVar5 = *data != cVar1;
      }
      if (!bVar5) break;
      data = data + 1;
    }
    if ((element_local <= data) || (*data != cVar1)) {
      return false;
    }
    pcVar3 = rtrim(pcVar2,data);
    length_00 = (int)pcVar3 - (int)pcVar2;
    if ((id_00 != 0) && (document_local != (plutosvg_document_t *)0x0)) {
      if (id_00 == 0x12) {
        if (*(long *)(it + 0x10) == 0) {
          phVar4 = hashmap_create();
          *(hashmap_t **)(it + 0x10) = phVar4;
        }
        hashmap_put(*(hashmap_t **)(it + 0x10),*(heap_t **)it,pcVar2,(long)length_00,document_local)
        ;
      }
      else if (id_00 == 0x25) {
        parse_style(pcVar2,length_00,(element_t *)document_local,(plutosvg_document_t *)it);
      }
      else {
        add_attribute((element_t *)document_local,(plutosvg_document_t *)it,id_00,pcVar2,
                      (long)length_00);
      }
    }
    data = data + 1;
    skip_ws(&data,(char *)element_local);
  }
  return false;
}

Assistant:

static bool parse_attributes(const char** begin, const char* end, element_t* element, plutosvg_document_t* document)
{
    const char* it = *begin;
    while(it < end && IS_STARTNAMECHAR(*it)) {
        const char* data = it++;
        while(it < end && IS_NAMECHAR(*it))
            ++it;
        int id = attributeid(data, it - data);
        skip_ws(&it, end);
        if(it >= end || *it != '=')
            return false;
        ++it;
        skip_ws(&it, end);
        if(it >= end || (*it != '"' && *it != '\''))
            return false;
        const char quote = *it++;
        skip_ws(&it, end);
        data = it;
        while(it < end && *it != quote)
            ++it;
        if(it >= end || *it != quote)
            return false;
        int length = rtrim(data, it) - data;
        if(id && element) {
            if(id == ATTR_ID) {
                if(document->id_cache == NULL)
                    document->id_cache = hashmap_create();
                hashmap_put(document->id_cache, document->heap, data, length, element);
            } else if(id == ATTR_STYLE) {
                parse_style(data, length, element, document);
            } else {
                add_attribute(element, document, id, data, length);
            }
        }

        ++it;
        skip_ws(&it, end);
    }

    *begin = it;
    return true;
}